

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigInd.c
# Opt level: O1

int Saig_ManAddUniqueness
              (sat_solver *pSat,Vec_Int_t *vState,int nRegs,int i,int k,int *pnSatVarNum,
              int *pnClauses,int fVerbose)

{
  int iVarB;
  int iVarC;
  int *piVar1;
  int iVar2;
  ulong uVar3;
  lit *begin;
  int iVar4;
  uint uVar5;
  char *__s;
  int iVar6;
  int iVar7;
  
  if (((k <= i) || (i == 0)) || (k == 0)) {
    __assert_fail("i && k && i < k",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigInd.c"
                  ,0x60,
                  "int Saig_ManAddUniqueness(sat_solver *, Vec_Int_t *, int, int, int, int *, int *, int)"
                 );
  }
  iVar6 = k * nRegs;
  if (vState->nSize < iVar6) {
    __assert_fail("nRegs * k <= Vec_IntSize(vState)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigInd.c"
                  ,0x61,
                  "int Saig_ManAddUniqueness(sat_solver *, Vec_Int_t *, int, int, int, int *, int *, int)"
                 );
  }
  piVar1 = vState->pArray;
  iVar4 = i * nRegs;
  if (0 < nRegs) {
    uVar3 = 0;
    do {
      if ((-1 < piVar1[(long)iVar4 + uVar3]) && (piVar1[(long)iVar6 + uVar3] == -1)) {
        iVar6 = 0;
        if (fVerbose == 0) {
          return 0;
        }
        __s = "Cannot constrain an incomplete state.";
        goto LAB_00622c7d;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)nRegs != uVar3);
  }
  iVar7 = *pnSatVarNum;
  if (0 < nRegs) {
    uVar3 = 0;
    do {
      if (-1 < piVar1[(long)iVar4 + uVar3]) {
        *pnClauses = *pnClauses + 4;
        iVar2 = piVar1[(long)iVar4 + uVar3];
        iVarB = piVar1[(long)iVar6 + uVar3];
        iVarC = *pnSatVarNum;
        *pnSatVarNum = iVarC + 1;
        iVar2 = Cnf_DataAddXorClause(pSat,iVar2,iVarB,iVarC);
        if (iVar2 == 0) {
          if (fVerbose == 0) {
            return 1;
          }
          goto LAB_00622c76;
        }
      }
      uVar3 = uVar3 + 1;
    } while ((uint)nRegs != uVar3);
  }
  *pnClauses = *pnClauses + 1;
  begin = (lit *)malloc((long)nRegs << 2);
  uVar3 = 0;
  uVar5 = *pnSatVarNum - iVar7;
  if (uVar5 != 0 && iVar7 <= *pnSatVarNum) {
    iVar7 = iVar7 * 2;
    uVar3 = 0;
    do {
      begin[uVar3] = iVar7;
      uVar3 = uVar3 + 1;
      iVar7 = iVar7 + 2;
    } while (uVar5 != uVar3);
  }
  if (nRegs < (int)uVar3) {
    __assert_fail("iVars <= nRegs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigInd.c"
                  ,0x7e,
                  "int Saig_ManAddUniqueness(sat_solver *, Vec_Int_t *, int, int, int, int *, int *, int)"
                 );
  }
  iVar4 = sat_solver_addclause(pSat,begin,begin + (uVar3 & 0xffffffff));
  if (begin != (lit *)0x0) {
    free(begin);
  }
  iVar6 = 0;
  if ((iVar4 == 0) && (iVar6 = 1, fVerbose != 0)) {
LAB_00622c76:
    iVar6 = 1;
    __s = "SAT solver became UNSAT after adding a uniqueness constraint.";
LAB_00622c7d:
    puts(__s);
  }
  return iVar6;
}

Assistant:

int Saig_ManAddUniqueness( sat_solver * pSat, Vec_Int_t * vState, int nRegs, int i, int k, int * pnSatVarNum, int * pnClauses, int fVerbose )
{
    int * pStateI = (int *)Vec_IntArray(vState) + nRegs * i;
    int * pStateK = (int *)Vec_IntArray(vState) + nRegs * k;
    int v, iVars, nSatVarsOld, RetValue, * pClause;
    assert( i && k && i < k );
    assert( nRegs * k <= Vec_IntSize(vState) );
    // check if the states are available
    for ( v = 0; v < nRegs; v++ )
        if ( pStateI[v] >= 0 && pStateK[v] == -1 )
        {
            if ( fVerbose )
                printf( "Cannot constrain an incomplete state.\n" );
            return 0;
        }
    // add XORs
    nSatVarsOld = *pnSatVarNum;
    for ( v = 0; v < nRegs; v++ )
        if ( pStateI[v] >= 0 )
        {
            *pnClauses += 4;
            RetValue = Cnf_DataAddXorClause( pSat, pStateI[v], pStateK[v], (*pnSatVarNum)++ );
            if ( RetValue == 0 )
            {
                if ( fVerbose )
                    printf( "SAT solver became UNSAT after adding a uniqueness constraint.\n" );
                return 1;
            }
        }
    // add OR clause
    (*pnClauses)++;
    iVars = 0;
    pClause = ABC_ALLOC( int, nRegs );
    for ( v = nSatVarsOld; v < *pnSatVarNum; v++ )
        pClause[iVars++] = toLitCond( v, 0 );
    assert( iVars <= nRegs );
    RetValue = sat_solver_addclause( pSat, pClause, pClause + iVars );
    ABC_FREE( pClause );
    if ( RetValue == 0 )
    {
        if ( fVerbose )
            printf( "SAT solver became UNSAT after adding a uniqueness constraint.\n" );
        return 1;
    }
    return 0;
}